

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Array.cc
# Opt level: O0

void __thiscall qpdf::Array::push_back(Array *this,QPDFObjectHandle *item)

{
  QPDF_Array *pQVar1;
  bool bVar2;
  pointer pSVar3;
  pointer pSVar4;
  mapped_type *this_00;
  int local_24;
  QPDF_Array *local_20;
  QPDF_Array *a;
  QPDFObjectHandle *item_local;
  Array *this_local;
  
  a = (QPDF_Array *)item;
  item_local = (QPDFObjectHandle *)this;
  local_20 = array(this);
  checkOwnership(this,(QPDFObjectHandle *)a);
  bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)local_20);
  pQVar1 = a;
  if (bVar2) {
    pSVar3 = std::unique_ptr<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>::
             operator->(&local_20->sp);
    pSVar4 = std::unique_ptr<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>::
             operator->(&local_20->sp);
    local_24 = pSVar4->size;
    pSVar4->size = local_24 + 1;
    this_00 = std::
              map<int,_QPDFObjectHandle,_std::less<int>,_std::allocator<std::pair<const_int,_QPDFObjectHandle>_>_>
              ::operator[](&pSVar3->elements,&local_24);
    QPDFObjectHandle::operator=(this_00,(QPDFObjectHandle *)pQVar1);
  }
  else {
    std::vector<QPDFObjectHandle,std::allocator<QPDFObjectHandle>>::
    emplace_back<QPDFObjectHandle_const&>
              ((vector<QPDFObjectHandle,std::allocator<QPDFObjectHandle>> *)&local_20->elements,
               (QPDFObjectHandle *)a);
  }
  return;
}

Assistant:

void
Array::push_back(QPDFObjectHandle const& item)
{
    auto a = array();
    checkOwnership(item);
    if (a->sp) {
        a->sp->elements[(a->sp->size)++] = item;
    } else {
        a->elements.emplace_back(item);
    }
}